

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

void __thiscall testing::StrictMock<dying_buffer>::StrictMock(StrictMock<dying_buffer> *this)

{
  FunctionMocker<void_()> *this_00;
  
  (this->super_dying_buffer).super_test_buffer<int>.super_basic_buffer<int>.ptr_ = (int *)0x0;
  (this->super_dying_buffer).super_test_buffer<int>.super_basic_buffer<int>.size_ = 0;
  (this->super_dying_buffer).super_test_buffer<int>.super_basic_buffer<int>.capacity_ = 0;
  (this->super_dying_buffer).super_test_buffer<int>.super_basic_buffer<int>._vptr_basic_buffer =
       (_func_int **)&PTR_grow_001d4658;
  this_00 = &(this->super_dying_buffer).gmock0_die_131;
  internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)this_00);
  (this->super_dying_buffer).gmock0_die_131.super_FunctionMockerBase<void_()>.current_spec_.
  function_mocker_ = &this_00->super_FunctionMockerBase<void_()>;
  (this->super_dying_buffer).gmock0_die_131.super_FunctionMockerBase<void_()>.
  super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_001d4680;
  (this->super_dying_buffer).super_test_buffer<int>.super_basic_buffer<int>._vptr_basic_buffer =
       (_func_int **)&PTR_grow_001d45e8;
  Mock::FailUninterestingCalls(this);
  return;
}

Assistant:

StrictMock() {
    ::testing::Mock::FailUninterestingCalls(
        internal::ImplicitCast_<MockClass*>(this));
  }